

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O2

JavascriptNativeFloatArray * __thiscall
Js::JavascriptLibrary::CreateNativeFloatArray(JavascriptLibrary *this,uint32 length)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  JavascriptArray *this_00;
  DynamicType *arrayType;
  
  arrayType = (this->nativeFloatArrayType).ptr;
  if (arrayType == (DynamicType *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                ,0x1752,"(nativeFloatArrayType)","Where\'s nativeIntArrayType?");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    arrayType = (this->nativeFloatArrayType).ptr;
  }
  this_00 = (JavascriptArray *)
            JavascriptArray::New<double,Js::JavascriptNativeFloatArray,0u>
                      (length,arrayType,this->recycler);
  JavascriptArray::CheckForceES5Array(this_00);
  return (JavascriptNativeFloatArray *)this_00;
}

Assistant:

JavascriptNativeFloatArray* JavascriptLibrary::CreateNativeFloatArray(uint32 length)
    {
        AssertMsg(nativeFloatArrayType, "Where's nativeIntArrayType?");
        JavascriptNativeFloatArray* arr = JavascriptArray::New<double, JavascriptNativeFloatArray, 0>(length, nativeFloatArrayType, this->GetRecycler());
        JS_ETW(EventWriteJSCRIPT_RECYCLER_ALLOCATE_ARRAY(arr));

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        arr->CheckForceES5Array();
#endif
        return arr;
    }